

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O3

X509CertificateExtension *
QTlsPrivate::X509CertificateOpenSSL::convertExtension
          (X509CertificateExtension *__return_storage_ptr__,X509_EXTENSION *ext)

{
  char *pcVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int *piVar5;
  Data *pDVar6;
  undefined1 *puVar7;
  Data *pDVar8;
  int iVar9;
  uint uVar10;
  ASN1_OBJECT *pAVar11;
  X509V3_EXT_METHOD *pXVar12;
  BASIC_CONSTRAINTS *a;
  QVariant *pQVar13;
  long lVar14;
  OPENSSL_STACK *a_00;
  undefined8 *puVar15;
  QLoggingCategory *pQVar16;
  AUTHORITY_KEYID *a_01;
  ASN1_VALUE *pAVar17;
  stack_st_CONF_VALUE *a_02;
  void *pvVar18;
  storage_type *psVar19;
  ASN1_OCTET_STRING *pAVar20;
  uchar *puVar21;
  char *pcVar22;
  BIO_METHOD *a_03;
  BIO *a_04;
  ASN1_ITEM *pAVar23;
  X509CertificateOpenSSL *pXVar24;
  bool bVar25;
  storage_type *psVar26;
  int iVar27;
  QMap *this;
  long in_FS_OFFSET;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  char *bio_buffer;
  char buf [80];
  QString local_128;
  QMap<QString,_QVariant> local_108;
  QString local_100;
  QString local_e8;
  QArrayDataPointer<QVariant> local_c8;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  undefined1 *puStack_90;
  anon_union_24_3_e3d07ef4_for_data local_88;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->critical = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->oid).d.d = (Data *)0x0;
  (__return_storage_ptr__->oid).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->oid).d.size = 0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->value).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).d.data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).d.data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->value).d.field_0x18 = 2;
  __return_storage_ptr__->critical = false;
  __return_storage_ptr__->supported = false;
  pAVar11 = q_X509_EXTENSION_get_object(ext);
  if (pAVar11 == (ASN1_OBJECT *)0x0) goto LAB_0011f4de;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88._16_4_ = 0;
  local_88._20_4_ = 0;
  pcStack_70 = (char *)0x0;
  local_88._0_4_ = 0;
  local_88._4_4_ = 0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  q_OBJ_obj2txt((char *)local_88.data,0x50,pAVar11,1);
  QByteArray::QByteArray((QByteArray *)&local_a8,(char *)local_88.data,-1);
  QVar28.m_data = (storage_type *)local_a8._16_8_;
  QVar28.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar28);
  pQVar2 = &((__return_storage_ptr__->oid).d.d)->super_QArrayData;
  pcVar3 = (__return_storage_ptr__->oid).d.ptr;
  pDVar6 = (Data *)CONCAT44(local_88._4_4_,local_88._0_4_);
  local_88._0_4_ = SUB84(pQVar2,0);
  local_88._4_4_ = (undefined4)((ulong)pQVar2 >> 0x20);
  (__return_storage_ptr__->oid).d.d = pDVar6;
  (__return_storage_ptr__->oid).d.ptr = (char16_t *)CONCAT44(local_88._12_4_,local_88._8_4_);
  local_88._8_4_ = SUB84(pcVar3,0);
  local_88._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
  qVar4 = (__return_storage_ptr__->oid).d.size;
  (__return_storage_ptr__->oid).d.size = CONCAT44(local_88._20_4_,local_88._16_4_);
  local_88._16_4_ = (undefined4)qVar4;
  local_88._20_4_ = (undefined4)((ulong)qVar4 >> 0x20);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
    UNLOCK();
    if (*(int *)local_a8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.shared,1,0x10);
    }
  }
  anon_unknown_2::asn1ObjectName((QByteArray *)&local_a8,pAVar11);
  QVar29.m_data = (storage_type *)local_a8._16_8_;
  QVar29.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar29);
  pQVar2 = &((__return_storage_ptr__->name).d.d)->super_QArrayData;
  pcVar3 = (__return_storage_ptr__->name).d.ptr;
  pDVar6 = (Data *)CONCAT44(local_88._4_4_,local_88._0_4_);
  local_88._0_4_ = SUB84(pQVar2,0);
  local_88._4_4_ = (undefined4)((ulong)pQVar2 >> 0x20);
  (__return_storage_ptr__->name).d.d = pDVar6;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)CONCAT44(local_88._12_4_,local_88._8_4_);
  local_88._8_4_ = SUB84(pcVar3,0);
  local_88._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
  qVar4 = (__return_storage_ptr__->name).d.size;
  (__return_storage_ptr__->name).d.size = CONCAT44(local_88._20_4_,local_88._16_4_);
  local_88._16_4_ = (undefined4)qVar4;
  local_88._20_4_ = (undefined4)((ulong)qVar4 >> 0x20);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
    UNLOCK();
    if (*(int *)local_a8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.shared,1,0x10);
    }
  }
  iVar9 = q_X509_EXTENSION_get_critical(ext);
  __return_storage_ptr__->critical = iVar9 != 0;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pAVar11 = q_X509_EXTENSION_get_object(ext);
  iVar9 = q_OBJ_obj2nid(pAVar11);
  pXVar12 = q_X509V3_EXT_get(ext);
  if (iVar9 < 0x5a) {
    if (iVar9 == 0x52) {
      pAVar17 = (ASN1_VALUE *)q_X509V3_EXT_d2i(ext);
      if (pAVar17 != (ASN1_VALUE *)0x0) {
        pcVar22 = (*pXVar12->i2s)(pXVar12,pAVar17);
        if (pcVar22 == (char *)0x0) {
          psVar26 = (storage_type *)0x0;
        }
        else {
          psVar19 = (storage_type *)0xffffffffffffffff;
          do {
            psVar26 = psVar19 + 1;
            pcVar1 = pcVar22 + 1 + (long)psVar19;
            psVar19 = psVar26;
          } while (*pcVar1 != '\0');
        }
        QVar37.m_data = psVar26;
        QVar37.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar37);
        QVariant::QVariant((QVariant *)&local_a8,(QString *)&local_88);
        piVar5 = (int *)CONCAT44(local_88._4_4_,local_88._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_88._4_4_,local_88._0_4_),2,0x10);
          }
        }
        if (pcVar22 != (char *)0x0) {
          q_CRYPTO_free(pcVar22,"",0);
        }
        if (pXVar12 != (X509V3_EXT_METHOD *)0x0) {
          if (pXVar12->it == (ASN1_ITEM_EXP *)0x0) {
            if (pXVar12->ext_free == (X509V3_EXT_FREE)0x0) {
              pXVar24 = (X509CertificateOpenSSL *)lcTlsBackend();
              if (((ulong)(pXVar24->super_X509CertificateBase).versionString.d.d & 0x100) != 0) {
                convertExtension(pXVar24);
              }
            }
            else {
              (*pXVar12->ext_free)(pAVar17);
            }
          }
          else {
            pAVar23 = (*pXVar12->it)();
            q_ASN1_item_free(pAVar17,pAVar23);
          }
        }
        goto LAB_0011ef25;
      }
    }
    else if ((iVar9 == 0x57) &&
            (a = (BASIC_CONSTRAINTS *)q_X509V3_EXT_d2i(ext), a != (BASIC_CONSTRAINTS *)0x0)) {
      local_100.d.d = (Data *)0x0;
      QVariant::QVariant((QVariant *)&local_88,a->ca != 0);
      QVar30.m_data = (storage_type *)0x2;
      QVar30.m_size = (qsizetype)&local_c8;
      QString::fromLatin1(QVar30);
      local_e8.d.d = (Data *)local_c8.d;
      local_e8.d.ptr = (char16_t *)local_c8.ptr;
      local_e8.d.size = local_c8.size;
      pQVar13 = QMap<QString,_QVariant>::operator[]((QMap<QString,_QVariant> *)&local_100,&local_e8)
      ;
      QVariant::operator=(pQVar13,(QVariant *)&local_88);
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVariant::~QVariant((QVariant *)&local_88);
      if (a->pathlen != (ASN1_INTEGER *)0x0) {
        lVar14 = q_ASN1_INTEGER_get(a->pathlen);
        QVariant::QVariant((QVariant *)&local_88,lVar14);
        QVar31.m_data = (storage_type *)0x11;
        QVar31.m_size = (qsizetype)&local_c8;
        QString::fromLatin1(QVar31);
        local_e8.d.d = (Data *)local_c8.d;
        local_e8.d.ptr = (char16_t *)local_c8.ptr;
        local_e8.d.size = local_c8.size;
        pQVar13 = QMap<QString,_QVariant>::operator[]
                            ((QMap<QString,_QVariant> *)&local_100,&local_e8);
        QVariant::operator=(pQVar13,(QVariant *)&local_88);
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        QVariant::~QVariant((QVariant *)&local_88);
      }
      q_BASIC_CONSTRAINTS_free(a);
      this = (QMap *)&local_100;
      goto LAB_0011ee0c;
    }
LAB_0011ee21:
    local_a8.shared = (PrivateShared *)0x0;
    local_a8._8_8_ = (undefined1 *)0x0;
    local_a8._16_8_ = (storage_type *)0x0;
    puStack_90 = (undefined1 *)0x2;
LAB_0011ef37:
    pXVar12 = q_X509V3_EXT_get(ext);
    if (pXVar12 == (X509V3_EXT_METHOD *)0x0) {
      pAVar20 = q_X509_EXTENSION_get_data(ext);
      local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      puVar21 = q_ASN1_STRING_get0_data(pAVar20);
      iVar9 = q_ASN1_STRING_length(pAVar20);
      QByteArray::QByteArray((QByteArray *)&local_c8,(char *)puVar21,(long)iVar9);
      QVariant::QVariant((QVariant *)&local_88,(QByteArray *)&local_c8);
      if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d)->super_QArrayData,1,0x10);
        }
      }
    }
    else {
      pAVar17 = (ASN1_VALUE *)q_X509V3_EXT_d2i(ext);
      if (pAVar17 == (ASN1_VALUE *)0x0) {
        local_88._0_4_ = 0;
        local_88._4_4_ = 0;
        local_88._8_4_ = 0;
        local_88._12_4_ = 0;
        local_88._16_4_ = 0;
        local_88._20_4_ = 0;
        pcStack_70 = (char *)0x2;
      }
      else {
        if (pXVar12->i2v == (X509V3_EXT_I2V)0x0) {
          if (pXVar12->i2s == (X509V3_EXT_I2S)0x0) {
            if (pXVar12->i2r == (X509V3_EXT_I2R)0x0) {
              local_88._0_4_ = 0;
              local_88._4_4_ = 0;
              local_88._8_4_ = 0;
              local_88._12_4_ = 0;
              local_88._16_4_ = 0;
              local_88._20_4_ = 0;
              pcStack_70 = (char *)0x2;
            }
            else {
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (QVariant *)0x0;
              local_c8.size = 0;
              a_03 = q_BIO_s_mem();
              a_04 = q_BIO_new(a_03);
              if (a_04 != (BIO *)0x0) {
                (*pXVar12->i2r)(pXVar12,pAVar17,a_04,0);
                local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                lVar14 = q_BIO_ctrl(a_04,3,0,&local_e8);
                QByteArray::QByteArray
                          ((QByteArray *)&local_88,(char *)local_e8.d.d,(long)(int)lVar14);
                pDVar8 = local_c8.d;
                pQVar2 = (QArrayData *)CONCAT44(local_88._4_4_,local_88._0_4_);
                pQVar13 = (QVariant *)CONCAT44(local_88._12_4_,local_88._8_4_);
                local_88._0_4_ = SUB84(local_c8.d,0);
                local_88._4_4_ = (undefined4)((ulong)local_c8.d >> 0x20);
                puVar7 = (undefined1 *)CONCAT44(local_88._20_4_,local_88._16_4_);
                local_88._8_4_ = SUB84(local_c8.ptr,0);
                local_88._12_4_ = (undefined4)((ulong)local_c8.ptr >> 0x20);
                local_88._16_4_ = (undefined4)local_c8.size;
                local_88._20_4_ = (undefined4)((ulong)local_c8.size >> 0x20);
                local_c8.ptr = pQVar13;
                local_c8.size = (qsizetype)puVar7;
                if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    local_c8.d = (Data *)pQVar2;
                    QArrayData::deallocate(&pDVar8->super_QArrayData,1,0x10);
                    pQVar2 = &(local_c8.d)->super_QArrayData;
                  }
                }
                local_c8.d = (Data *)pQVar2;
                q_BIO_free(a_04);
              }
              QVariant::QVariant((QVariant *)&local_88,(QByteArray *)&local_c8);
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,1,0x10);
                }
              }
            }
          }
          else {
            pcVar22 = (*pXVar12->i2s)(pXVar12,pAVar17);
            local_88._0_4_ = 0xaaaaaaaa;
            local_88._4_4_ = 0xaaaaaaaa;
            local_88._8_4_ = 0xaaaaaaaa;
            local_88._12_4_ = 0xaaaaaaaa;
            local_88._16_4_ = 0xaaaaaaaa;
            local_88._20_4_ = 0xaaaaaaaa;
            pcStack_70 = &DAT_aaaaaaaaaaaaaaaa;
            if (pcVar22 == (char *)0x0) {
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (QVariant *)0x0;
              local_c8.size = 0;
            }
            else {
              psVar26 = (storage_type *)0xffffffffffffffff;
              do {
                pcVar1 = pcVar22 + 1 + (long)psVar26;
                psVar26 = psVar26 + 1;
              } while (*pcVar1 != '\0');
              QVar41.m_data = psVar26;
              QVar41.m_size = (qsizetype)&local_c8;
              QString::fromUtf8(QVar41);
            }
            QVariant::QVariant((QVariant *)&local_88,(QString *)&local_c8);
            if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
              }
            }
            q_CRYPTO_free(pcVar22,"",0);
          }
        }
        else {
          iVar27 = 0;
          a_02 = (*pXVar12->i2v)(pXVar12,pAVar17,(stack_st_CONF_VALUE *)0x0);
          local_128.d.d = (Data *)0x0;
          local_c8.size = 0;
          local_c8.d = (Data *)0x0;
          local_c8.ptr = (QVariant *)0x0;
          iVar9 = q_OPENSSL_sk_num((OPENSSL_STACK *)a_02);
          if (iVar9 < 1) {
LAB_0011f229:
            QVariant::QVariant((QVariant *)&local_88,(QList *)&local_c8);
          }
          else {
            bVar25 = false;
            do {
              while( true ) {
                pvVar18 = q_OPENSSL_sk_value((OPENSSL_STACK *)a_02,iVar27);
                lVar14 = *(long *)((long)pvVar18 + 0x10);
                if (*(long *)((long)pvVar18 + 8) != 0) break;
                if (lVar14 != 0) {
                  psVar26 = (storage_type *)0xffffffffffffffff;
                  do {
                    pcVar22 = psVar26 + lVar14 + 1;
                    psVar26 = psVar26 + 1;
                  } while (*pcVar22 != '\0');
                  goto LAB_0011f01a;
                }
LAB_0011f078:
                iVar27 = iVar27 + 1;
                iVar9 = q_OPENSSL_sk_num((OPENSSL_STACK *)a_02);
                if (iVar9 <= iVar27) {
                  if (!bVar25) goto LAB_0011f229;
                  goto LAB_0011f215;
                }
              }
              psVar26 = (storage_type *)0xffffffffffffffff;
              if (lVar14 == 0) {
                do {
                  pcVar22 = psVar26 + *(long *)((long)pvVar18 + 8) + 1;
                  psVar26 = psVar26 + 1;
                } while (*pcVar22 != '\0');
LAB_0011f01a:
                QVar38.m_data = psVar26;
                QVar38.m_size = (qsizetype)&local_e8;
                QString::fromUtf8(QVar38);
                QVariant::QVariant((QVariant *)&local_88,&local_e8);
                QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                          ((QMovableArrayOps<QVariant> *)&local_c8,local_c8.size,
                           (QVariant *)&local_88);
                QList<QVariant>::end((QList<QVariant> *)&local_c8);
                QVariant::~QVariant((QVariant *)&local_88);
                if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                goto LAB_0011f078;
              }
              do {
                pcVar22 = psVar26 + lVar14 + 1;
                psVar26 = psVar26 + 1;
              } while (*pcVar22 != '\0');
              QVar39.m_data = psVar26;
              QVar39.m_size = (qsizetype)&local_e8;
              QString::fromUtf8(QVar39);
              QVariant::QVariant((QVariant *)&local_88,&local_e8);
              if (*(long *)((long)pvVar18 + 8) == 0) {
                psVar26 = (storage_type *)0x0;
              }
              else {
                psVar19 = (storage_type *)0xffffffffffffffff;
                do {
                  psVar26 = psVar19 + 1;
                  pcVar22 = psVar19 + *(long *)((long)pvVar18 + 8) + 1;
                  psVar19 = psVar26;
                } while (*pcVar22 != '\0');
              }
              QVar40.m_data = psVar26;
              QVar40.m_size = (qsizetype)&local_100;
              QString::fromUtf8(QVar40);
              pQVar13 = QMap<QString,_QVariant>::operator[]
                                  ((QMap<QString,_QVariant> *)&local_128,&local_100);
              QVariant::operator=(pQVar13,(QVariant *)&local_88);
              if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
                }
              }
              QVariant::~QVariant((QVariant *)&local_88);
              if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                }
              }
              iVar27 = iVar27 + 1;
              iVar9 = q_OPENSSL_sk_num((OPENSSL_STACK *)a_02);
              bVar25 = true;
            } while (iVar27 < iVar9);
LAB_0011f215:
            QVariant::QVariant((QVariant *)&local_88,(QMap *)&local_128);
          }
          QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_c8);
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                      *)&local_128);
          if (a_02 != (stack_st_CONF_VALUE *)0x0) {
            q_OPENSSL_sk_pop_free((OPENSSL_STACK *)a_02,q_X509V3_conf_free);
          }
        }
        if (pXVar12->it == (ASN1_ITEM_EXP *)0x0) {
          if (pXVar12->ext_free == (X509V3_EXT_FREE)0x0) {
            pXVar24 = (X509CertificateOpenSSL *)lcTlsBackend();
            if (((ulong)(pXVar24->super_X509CertificateBase).versionString.d.d & 0x100) != 0) {
              convertExtension(pXVar24);
            }
          }
          else {
            (*pXVar12->ext_free)(pAVar17);
          }
        }
        else {
          pAVar23 = (*pXVar12->it)();
          q_ASN1_item_free(pAVar17,pAVar23);
        }
      }
    }
    QVariant::operator=((QVariant *)&local_a8,(QVariant *)&local_88);
    QVariant::~QVariant((QVariant *)&local_88);
    bVar25 = false;
    if ((undefined1 *)0x3 < puStack_90) goto LAB_0011f4bc;
  }
  else {
    if (iVar9 == 0x5a) {
      a_01 = (AUTHORITY_KEYID *)q_X509V3_EXT_d2i(ext);
      if (a_01 == (AUTHORITY_KEYID *)0x0) goto LAB_0011ee21;
      local_108.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
              )0x0;
      pAVar20 = a_01->keyid;
      if (pAVar20 != (ASN1_OCTET_STRING *)0x0) {
        local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)&local_e8,(char *)pAVar20->data,(long)pAVar20->length);
        QByteArray::toHex('\0');
        QVariant::QVariant((QVariant *)&local_88,(QByteArray *)&local_100);
        QVar35.m_data = (storage_type *)0x5;
        QVar35.m_size = (qsizetype)&local_c8;
        QString::fromLatin1(QVar35);
        local_128.d.d = (Data *)local_c8.d;
        local_128.d.ptr = (char16_t *)local_c8.ptr;
        local_128.d.size = local_c8.size;
        pQVar13 = QMap<QString,_QVariant>::operator[](&local_108,&local_128);
        QVariant::operator=(pQVar13,(QVariant *)&local_88);
        if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
          }
        }
        QVariant::~QVariant((QVariant *)&local_88);
        if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      if (a_01->serial != (ASN1_INTEGER *)0x0) {
        lVar14 = q_ASN1_INTEGER_get(a_01->serial);
        QVariant::QVariant((QVariant *)&local_88,lVar14);
        QVar36.m_data = (storage_type *)0x6;
        QVar36.m_size = (qsizetype)&local_c8;
        QString::fromLatin1(QVar36);
        local_e8.d.d = (Data *)local_c8.d;
        local_e8.d.ptr = (char16_t *)local_c8.ptr;
        local_e8.d.size = local_c8.size;
        pQVar13 = QMap<QString,_QVariant>::operator[](&local_108,&local_e8);
        QVariant::operator=(pQVar13,(QVariant *)&local_88);
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        QVariant::~QVariant((QVariant *)&local_88);
      }
      q_AUTHORITY_KEYID_free(a_01);
      this = (QMap *)&local_108;
LAB_0011ee0c:
      QVariant::QVariant((QVariant *)&local_a8,this);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)this);
    }
    else {
      if ((iVar9 != 0xb1) ||
         (a_00 = (OPENSSL_STACK *)q_X509V3_EXT_d2i(ext), a_00 == (OPENSSL_STACK *)0x0))
      goto LAB_0011ee21;
      local_128.d.d = (Data *)0x0;
      iVar9 = q_OPENSSL_sk_num(a_00);
      if (0 < iVar9) {
        iVar9 = 0;
        do {
          puVar15 = (undefined8 *)q_OPENSSL_sk_value(a_00,iVar9);
          piVar5 = (int *)puVar15[1];
          if (*piVar5 == 6) {
            uVar10 = q_ASN1_STRING_length(*(ASN1_STRING **)(piVar5 + 2));
            if (uVar10 < 0x2000) {
              puVar21 = q_ASN1_STRING_get0_data(*(ASN1_STRING **)(piVar5 + 2));
              psVar26 = (storage_type *)(ulong)uVar10;
              if (puVar21 == (uchar *)0x0) {
                psVar26 = (storage_type *)0x0;
              }
              local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
              QVar32.m_data = psVar26;
              QVar32.m_size = (qsizetype)&local_c8;
              QString::fromUtf8(QVar32);
              QVariant::QVariant((QVariant *)&local_88,(QString *)&local_c8);
              anon_unknown_2::asn1ObjectName((QByteArray *)&local_100,(ASN1_OBJECT *)*puVar15);
              QVar33.m_data = (storage_type *)local_100.d.size;
              QVar33.m_size = (qsizetype)&local_e8;
              QString::fromUtf8(QVar33);
              pQVar13 = QMap<QString,_QVariant>::operator[]
                                  ((QMap<QString,_QVariant> *)&local_128,&local_e8);
              QVariant::operator=(pQVar13,(QVariant *)&local_88);
              if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,1,0x10);
                }
              }
              QVariant::~QVariant((QVariant *)&local_88);
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          else {
            pQVar16 = lcTlsBackend();
            if (((pQVar16->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              pcStack_70 = pQVar16->name;
              local_88._0_4_ = 2;
              local_88._4_4_ = 0;
              local_88._8_4_ = 0;
              local_88._12_4_ = 0;
              local_88._16_4_ = 0;
              local_88._20_4_ = 0;
              QMessageLogger::warning();
              pDVar6 = local_e8.d.d;
              QVar34.m_data = (storage_type *)0x15;
              QVar34.m_size = (qsizetype)&local_c8;
              QString::fromUtf8(QVar34);
              QTextStream::operator<<((QTextStream *)pDVar6,(QString *)&local_c8);
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                }
              }
              if ((char)local_e8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                  == '\x01') {
                QTextStream::operator<<((QTextStream *)local_e8.d.d,' ');
              }
              QTextStream::operator<<((QTextStream *)local_e8.d.d,*piVar5);
              if ((char)local_e8.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i
                  == '\x01') {
                QTextStream::operator<<((QTextStream *)local_e8.d.d,' ');
              }
              QDebug::~QDebug((QDebug *)&local_e8);
            }
          }
          iVar9 = iVar9 + 1;
          iVar27 = q_OPENSSL_sk_num(a_00);
        } while (iVar9 < iVar27);
      }
      q_AUTHORITY_INFO_ACCESS_free((AUTHORITY_INFO_ACCESS *)a_00);
      QVariant::QVariant((QVariant *)&local_a8,(QMap *)&local_128);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)&local_128);
    }
LAB_0011ef25:
    bVar25 = true;
    if (puStack_90 < (undefined1 *)0x4) goto LAB_0011ef37;
LAB_0011f4bc:
    QVariant::operator=(&__return_storage_ptr__->value,(QVariant *)&local_a8);
  }
  __return_storage_ptr__->supported = bVar25;
  QVariant::~QVariant((QVariant *)&local_a8);
LAB_0011f4de:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

X509CertificateBase::X509CertificateExtension X509CertificateOpenSSL::convertExtension(X509_EXTENSION *ext)
{
    Q_ASSERT(ext);

    X509CertificateExtension result;

    ASN1_OBJECT *obj = q_X509_EXTENSION_get_object(ext);
    if (!obj)
        return result;

    result.oid = QString::fromUtf8(asn1ObjectId(obj));
    result.name = QString::fromUtf8(asn1ObjectName(obj));

    result.critical = bool(q_X509_EXTENSION_get_critical(ext));

    // Lets see if we have custom support for this one
    QVariant extensionValue = x509ExtensionToValue(ext);
    if (extensionValue.isValid()) {
        result.value = extensionValue;
        result.supported = true;
        return result;
    }

    extensionValue = x509UnknownExtensionToValue(ext);
    if (extensionValue.isValid())
        result.value = extensionValue;

    result.supported = false;

    return result;
}